

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_bench.cpp
# Opt level: O0

void bench_recorder(char *path,bool compressed,bool checksum)

{
  bool bVar1;
  uint uVar2;
  result_type rVar3;
  DatabaseInterface *__p;
  pointer iface_00;
  reference puVar4;
  reference pvVar5;
  size_type sVar6;
  undefined1 local_1ab8 [8];
  VkPipelineViewportStateCreateInfo vp;
  VkPipelineMultisampleStateCreateInfo ms;
  VkPipelineRasterizationStateCreateInfo rs;
  VkPipelineInputAssemblyStateCreateInfo ia;
  VkPipelineDynamicStateCreateInfo dyn;
  VkPipelineDepthStencilStateCreateInfo ds;
  VkPipelineVertexInputStateCreateInfo vi;
  VkPipelineColorBlendStateCreateInfo cb;
  VkPipelineShaderStageCreateInfo stages [2];
  undefined1 local_18a0 [8];
  VkGraphicsPipelineCreateInfo info_4;
  undefined8 uStack_1808;
  uint i_5;
  VkAttachmentReference colors [4];
  undefined1 local_17e0 [8];
  VkSubpassDescription subpass;
  VkAttachmentDescription *att;
  VkAttachmentDescription *__end2;
  VkAttachmentDescription *__begin2;
  VkAttachmentDescription (*__range2) [4];
  VkAttachmentDescription attachments [4];
  VkRenderPassCreateInfo info_3;
  uint i_4;
  uniform_int_distribution<int> format_dist;
  VkDescriptorSetLayout set_layouts [4];
  undefined1 local_1670 [8];
  VkPipelineLayoutCreateInfo info_2;
  uint i_3;
  uint j;
  VkDescriptorSetLayoutBinding bindings [16];
  undefined1 local_14b0 [8];
  VkDescriptorSetLayoutCreateInfo info_1;
  undefined1 auStack_1488 [4];
  uint i_2;
  VkSamplerCreateInfo sampler;
  uint local_142c;
  undefined1 local_1428 [4];
  uint i_1;
  VkShaderModuleCreateInfo info;
  uint i;
  uint *d;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  undefined1 local_13d0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> dummy_spirv;
  uniform_int_distribution<int> dist;
  mt19937 rnd;
  StateRecorder recorder;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_> iface
  ;
  bool checksum_local;
  bool compressed_local;
  char *path_local;
  
  remove(path);
  __p = Fossilize::create_database(path,OverWrite);
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)&recorder,__p);
  Fossilize::StateRecorder::StateRecorder((StateRecorder *)&rnd._M_p);
  Fossilize::StateRecorder::set_database_enable_checksum((StateRecorder *)&rnd._M_p,checksum);
  Fossilize::StateRecorder::set_database_enable_compression((StateRecorder *)&rnd._M_p,compressed);
  iface_00 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::get((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                    *)&recorder);
  Fossilize::StateRecorder::init_recording_thread((StateRecorder *)&rnd._M_p,iface_00);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&dist,1);
  std::uniform_int_distribution<int>::uniform_int_distribution
            ((uniform_int_distribution<int> *)
             &dummy_spirv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1,500);
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&__range1 + 7));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_13d0,0x1000,
             (allocator_type *)((long)&__range1 + 7));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&__range1 + 7));
  __end1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_13d0);
  d = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_13d0);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&d);
    if (!bVar1) break;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end1);
    uVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)
                       &dummy_spirv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dist);
    *puVar4 = uVar2;
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end1);
  }
  info.pCode._4_4_ = 0;
  while( true ) {
    uVar2 = info.pCode._4_4_;
    if (9999 < info.pCode._4_4_) {
      local_142c = 0;
      while( true ) {
        if (9999 < local_142c) {
          info_1.pBindings._4_4_ = 0;
          while( true ) {
            if (9999 < info_1.pBindings._4_4_) {
              info_2.pPushConstantRanges._0_4_ = 0;
              while( true ) {
                if (8999 < (uint)info_2.pPushConstantRanges) {
                  std::uniform_int_distribution<int>::uniform_int_distribution
                            ((uniform_int_distribution<int> *)&stack0xffffffffffffe960,0,0xf);
                  info_3.pDependencies._4_4_ = 0;
                  while( true ) {
                    if (9999 < info_3.pDependencies._4_4_) {
                      info_4._140_4_ = 0;
                      while( true ) {
                        if (99999 < (uint)info_4._140_4_) {
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     local_13d0);
                          Fossilize::StateRecorder::~StateRecorder((StateRecorder *)&rnd._M_p);
                          std::
                          unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                          ::~unique_ptr((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
                                         *)&recorder);
                          return;
                        }
                        memset(local_18a0,0,0x90);
                        local_18a0._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
                        info_4.pDynamicState =
                             (VkPipelineDynamicStateCreateInfo *)
                             (ulong)((uint)info_4._140_4_ % 9000 + 1);
                        info_4.layout = (VkPipelineLayout)(ulong)((uint)info_4._140_4_ % 10000 + 1);
                        info_4.pNext._4_4_ = 2;
                        memset(cb.blendConstants + 2,0,0x60);
                        cb.blendConstants[2] = 2.52234e-44;
                        info_4._16_8_ = cb.blendConstants + 2;
                        memset(&vi.pVertexAttributeDescriptions,0,0x38);
                        vi.pVertexAttributeDescriptions._0_4_ = 0x1a;
                        info_4.pDepthStencilState =
                             (VkPipelineDepthStencilStateCreateInfo *)
                             &vi.pVertexAttributeDescriptions;
                        memset(&ds.minDepthBounds,0,0x30);
                        ds.minDepthBounds = 2.66247e-44;
                        info_4.pStages = (VkPipelineShaderStageCreateInfo *)&ds.minDepthBounds;
                        memset(&dyn.pDynamicStates,0,0x68);
                        dyn.pDynamicStates._0_4_ = 0x19;
                        info_4.pMultisampleState =
                             (VkPipelineMultisampleStateCreateInfo *)&dyn.pDynamicStates;
                        ia.primitiveRestartEnable = 0x1b;
                        ia._28_4_ = 0;
                        dyn.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                        dyn._4_4_ = 0;
                        dyn.pNext = (void *)0x0;
                        dyn.flags = 0;
                        dyn.dynamicStateCount = 0;
                        info_4.pColorBlendState =
                             (VkPipelineColorBlendStateCreateInfo *)&ia.primitiveRestartEnable;
                        rs.lineWidth = 2.8026e-44;
                        rs._60_4_ = 0;
                        ia.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                        ia._4_4_ = 0;
                        ia.pNext = (void *)0x0;
                        ia.flags = 0;
                        ia.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
                        info_4.pVertexInputState =
                             (VkPipelineVertexInputStateCreateInfo *)&rs.lineWidth;
                        memset(&ms.alphaToCoverageEnable,0,0x40);
                        ms.alphaToCoverageEnable = 0x17;
                        info_4.pViewportState =
                             (VkPipelineViewportStateCreateInfo *)&ms.alphaToCoverageEnable;
                        memset(&vp.pScissors,0,0x30);
                        vp.pScissors._0_4_ = 0x18;
                        info_4.pRasterizationState =
                             (VkPipelineRasterizationStateCreateInfo *)&vp.pScissors;
                        memset(local_1ab8,0,0x30);
                        local_1ab8._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
                        info_4.pTessellationState =
                             (VkPipelineTessellationStateCreateInfo *)local_1ab8;
                        bVar1 = Fossilize::StateRecorder::record_graphics_pipeline
                                          ((StateRecorder *)&rnd._M_p,
                                           (VkPipeline)(ulong)(info_4._140_4_ + 1),
                                           (VkGraphicsPipelineCreateInfo *)local_18a0,
                                           (VkPipeline *)0x0,0,0,(VkDevice)0x0,
                                           (PFN_vkGetShaderModuleCreateInfoIdentifierEXT)0x0);
                        if (!bVar1) break;
                        info_4._140_4_ = info_4._140_4_ + 1;
                      }
                      abort();
                    }
                    memset(&attachments[3].initialLayout,0,0x40);
                    attachments[3].initialLayout = 0x26;
                    memset(&__range2,0,0x90);
                    for (__end2 = (VkAttachmentDescription *)&__range2;
                        __end2 != (VkAttachmentDescription *)&attachments[3].initialLayout;
                        __end2 = __end2 + 1) {
                      subpass.pPreserveAttachments = &__end2->flags;
                      rVar3 = std::uniform_int_distribution<int>::operator()
                                        ((uniform_int_distribution<int> *)&stack0xffffffffffffe960,
                                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                          *)&dist);
                      subpass.pPreserveAttachments[1] = bench_recorder::random_formats[rVar3];
                      subpass.pPreserveAttachments[8] = 2;
                      subpass.pPreserveAttachments[7] = 2;
                      subpass.pPreserveAttachments[3] = 1;
                      subpass.pPreserveAttachments[4] = 0;
                      subpass.pPreserveAttachments[5] = 2;
                      subpass.pPreserveAttachments[6] = 1;
                      subpass.pPreserveAttachments[2] = 1;
                    }
                    memset(local_17e0,0,0x48);
                    subpass.pInputAttachments._0_4_ = 4;
                    uStack_1808 = 0x200000000;
                    colors[0].attachment = 1;
                    colors[0].layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
                    colors[1].attachment = 2;
                    colors[1].layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
                    colors[2].attachment = 3;
                    colors[2].layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
                    subpass._24_8_ = &stack0xffffffffffffe7f8;
                    bVar1 = Fossilize::StateRecorder::record_render_pass
                                      ((StateRecorder *)&rnd._M_p,
                                       (VkRenderPass)(ulong)(info_3.pDependencies._4_4_ + 1),
                                       (VkRenderPassCreateInfo *)&attachments[3].initialLayout,0);
                    if (!bVar1) break;
                    info_3.pDependencies._4_4_ = info_3.pDependencies._4_4_ + 1;
                  }
                  abort();
                }
                memset(local_1670,0,0x30);
                local_1670._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
                format_dist._M_param._M_a = (uint)info_2.pPushConstantRanges + 1;
                format_dist._M_param._M_b = 0;
                info_2._16_8_ = &format_dist;
                info_2.pNext._4_4_ = 4;
                bVar1 = Fossilize::StateRecorder::record_pipeline_layout
                                  ((StateRecorder *)&rnd._M_p,
                                   (VkPipelineLayout)(ulong)((uint)info_2.pPushConstantRanges + 1),
                                   (VkPipelineLayoutCreateInfo *)local_1670,0);
                if (!bVar1) break;
                info_2.pPushConstantRanges._0_4_ = (uint)info_2.pPushConstantRanges + 1;
              }
              abort();
            }
            local_14b0 = (undefined1  [8])0x20;
            info_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
            info_1._4_4_ = 0;
            info_1.flags = 0;
            info_1.bindingCount = 0;
            info_1.pNext = (void *)0x1000000000;
            memset(&i_3,0,0x180);
            for (info_2.pPushConstantRanges._4_4_ = 0; info_2.pPushConstantRanges._4_4_ < 0x10;
                info_2.pPushConstantRanges._4_4_ = info_2.pPushConstantRanges._4_4_ + 1) {
              *(undefined4 *)
               ((long)&bindings[(ulong)info_2.pPushConstantRanges._4_4_ - 1].pImmutableSamplers + 4)
                   = 1;
              (&i_3)[(ulong)info_2.pPushConstantRanges._4_4_ * 6] =
                   info_1.pBindings._4_4_ + info_2.pPushConstantRanges._4_4_;
              bindings[info_2.pPushConstantRanges._4_4_].binding = 3;
              bindings[info_2.pPushConstantRanges._4_4_].descriptorType =
                   VK_DESCRIPTOR_TYPE_MAX_ENUM;
            }
            info_1._16_8_ = &i_3;
            bVar1 = Fossilize::StateRecorder::record_descriptor_set_layout
                              ((StateRecorder *)&rnd._M_p,
                               (VkDescriptorSetLayout)(ulong)(info_1.pBindings._4_4_ + 1),
                               (VkDescriptorSetLayoutCreateInfo *)local_14b0,0);
            if (!bVar1) break;
            info_1.pBindings._4_4_ = info_1.pBindings._4_4_ + 1;
          }
          abort();
        }
        sampler.minLod = 0.0;
        sampler.maxLod = 0.0;
        sampler.addressModeW = VK_SAMPLER_ADDRESS_MODE_REPEAT;
        sampler.mipLodBias = 0.0;
        sampler.anisotropyEnable = 0;
        sampler.maxAnisotropy = 0.0;
        sampler.pNext = (void *)0x0;
        sampler.flags = 0;
        sampler.magFilter = VK_FILTER_NEAREST;
        sampler.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        sampler._4_4_ = 0;
        auStack_1488 = (undefined1  [4])0x1f;
        i_2 = 0;
        sampler.minFilter = 2;
        sampler.mipmapMode = 2;
        sampler.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
        sampler.addressModeV = VK_SAMPLER_ADDRESS_MODE_REPEAT;
        sampler.compareOp = VK_COMPARE_OP_NEVER;
        sampler.compareEnable = (VkBool32)(float)local_142c;
        bVar1 = Fossilize::StateRecorder::record_sampler
                          ((StateRecorder *)&rnd._M_p,(VkSampler)(ulong)(local_142c + 1),
                           (VkSamplerCreateInfo *)auStack_1488,0);
        if (!bVar1) break;
        local_142c = local_142c + 1;
      }
      abort();
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_13d0,0);
    *pvVar5 = uVar2;
    memset(local_1428,0,0x28);
    local_1428 = (undefined1  [4])0x10;
    sVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_13d0);
    info._16_8_ = sVar6 << 2;
    info.codeSize =
         (size_t)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_13d0);
    bVar1 = Fossilize::StateRecorder::record_shader_module
                      ((StateRecorder *)&rnd._M_p,(VkShaderModule)(ulong)(info.pCode._4_4_ + 1),
                       (VkShaderModuleCreateInfo *)local_1428,0);
    if (!bVar1) break;
    info.pCode._4_4_ = info.pCode._4_4_ + 1;
  }
  abort();
}

Assistant:

static void bench_recorder(const char *path, bool compressed, bool checksum)
{
	remove(path);
	auto iface = std::unique_ptr<DatabaseInterface>(create_database(path, DatabaseMode::OverWrite));
	StateRecorder recorder;
	recorder.set_database_enable_checksum(checksum);
	recorder.set_database_enable_compression(compressed);
	recorder.init_recording_thread(iface.get());

	std::mt19937 rnd(1);
	std::uniform_int_distribution<int> dist(1, 500);

	// Create 10000 random SPIR-V modules with reasonable ID distribution.
	std::vector<uint32_t> dummy_spirv(4096);
	for (auto &d : dummy_spirv)
		d = dist(rnd);

	for (unsigned i = 0; i < 10000; i++)
	{
		dummy_spirv[0] = i;

		VkShaderModuleCreateInfo info = { VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO };
		info.codeSize = dummy_spirv.size() * sizeof(uint32_t);
		info.pCode = dummy_spirv.data();
		if (!recorder.record_shader_module((VkShaderModule)uint64_t(i + 1), info))
			abort();
	}

	for (unsigned i = 0; i < 10000; i++)
	{
		VkSamplerCreateInfo sampler = { VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO };
		sampler.addressModeU = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
		sampler.addressModeV = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
		sampler.addressModeW = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
		sampler.minLod = float(i);
		if (!recorder.record_sampler((VkSampler)uint64_t(i + 1), sampler))
			abort();
	}

	for (unsigned i = 0; i < 10000; i++)
	{
		VkDescriptorSetLayoutCreateInfo info = { VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO };
		info.bindingCount = 16;
		VkDescriptorSetLayoutBinding bindings[16] = {};
		for (unsigned j = 0; j < 16; j++)
		{
			bindings[j].descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
			bindings[j].binding = i + j;
			bindings[j].descriptorCount = 3;
			bindings[j].stageFlags = VK_SHADER_STAGE_ALL;
		}
		info.pBindings = bindings;
		if (!recorder.record_descriptor_set_layout((VkDescriptorSetLayout)uint64_t(i + 1), info))
			abort();
	}

	for (unsigned i = 0; i < 9000; i++)
	{
		VkPipelineLayoutCreateInfo info = { VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO };
		VkDescriptorSetLayout set_layouts[4] = {
			(VkDescriptorSetLayout)uint64_t(i + 1),
			(VkDescriptorSetLayout)uint64_t(i + 2),
			(VkDescriptorSetLayout)uint64_t(i + 3),
			(VkDescriptorSetLayout)uint64_t(i + 4),
		};
		info.pSetLayouts = set_layouts;
		info.setLayoutCount = 4;
		if (!recorder.record_pipeline_layout((VkPipelineLayout)uint64_t(i + 1), info))
			abort();
	}

	std::uniform_int_distribution<int> format_dist(0, 15);

	for (unsigned i = 0; i < 10000; i++)
	{
		VkRenderPassCreateInfo info = { VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO };
		info.attachmentCount = 4;

		static const VkFormat random_formats[16] = {
			VK_FORMAT_R8_UNORM, VK_FORMAT_R8G8_UNORM, VK_FORMAT_R8G8B8A8_UNORM, VK_FORMAT_R8G8B8A8_SRGB,
			VK_FORMAT_R16_SFLOAT, VK_FORMAT_R16G16_SFLOAT, VK_FORMAT_R16G16B16A16_SFLOAT, VK_FORMAT_B10G11R11_UFLOAT_PACK32,
			VK_FORMAT_R32_SFLOAT, VK_FORMAT_R32G32_SFLOAT, VK_FORMAT_R32G32B32A32_SFLOAT, VK_FORMAT_B8G8R8A8_UNORM,
			VK_FORMAT_R8_UNORM, VK_FORMAT_R8G8_UNORM, VK_FORMAT_R8G8B8A8_UNORM, VK_FORMAT_R8G8B8A8_SRGB,
		};

		VkAttachmentDescription attachments[4] = {};
		for (auto &att : attachments)
		{
			att.format = random_formats[format_dist(rnd)];
			att.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
			att.initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
			att.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
			att.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
			att.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
			att.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
			att.samples = VK_SAMPLE_COUNT_1_BIT;
		}
		info.pAttachments = attachments;
		info.subpassCount = 1;

		VkSubpassDescription subpass = {};
		subpass.colorAttachmentCount = 4;
		VkAttachmentReference colors[4] = {
			{ 0, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL },
			{ 1, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL },
			{ 2, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL },
			{ 3, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL },
		};
		subpass.pColorAttachments = colors;
		info.pSubpasses = &subpass;

		if (!recorder.record_render_pass((VkRenderPass)uint64_t(i + 1), info))
			abort();
	}

	for (unsigned i = 0; i < 100000; i++)
	{
		VkGraphicsPipelineCreateInfo info = { VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO };
		info.layout = (VkPipelineLayout)uint64_t((i % 9000) + 1);
		info.renderPass = (VkRenderPass)uint64_t((i % 10000) + 1);
		info.stageCount = 2;
		VkPipelineShaderStageCreateInfo stages[2] = {};
		stages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
		stages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
		stages[0].pName = "main";
		stages[0].module = (VkShaderModule)uint64_t((i % 10000) + 1);
		stages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
		stages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
		stages[1].pName = "main";
		stages[1].module = (VkShaderModule)uint64_t(((3 * i) % 10000) + 1);
		info.pStages = stages;

		VkPipelineColorBlendStateCreateInfo cb = { VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO };
		info.pColorBlendState = &cb;

		VkPipelineVertexInputStateCreateInfo vi = { VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO };
		info.pVertexInputState = &vi;

		VkPipelineDepthStencilStateCreateInfo ds = { VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO };
		info.pDepthStencilState = &ds;

		VkPipelineDynamicStateCreateInfo dyn = { VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO };
		info.pDynamicState = &dyn;

		VkPipelineInputAssemblyStateCreateInfo ia = { VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO };
		info.pInputAssemblyState = &ia;

		VkPipelineRasterizationStateCreateInfo rs = { VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO };
		info.pRasterizationState = &rs;

		VkPipelineMultisampleStateCreateInfo ms = { VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO };
		info.pMultisampleState = &ms;

		VkPipelineViewportStateCreateInfo vp = { VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO };
		info.pViewportState = &vp;

		if (!recorder.record_graphics_pipeline((VkPipeline)uint64_t(i + 1), info, nullptr, 0))
			abort();
	}
}